

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

void __thiscall MeshLib::Solid::labelBoundaryEdges(Solid *this)

{
  HalfEdge *this_00;
  bool bVar1;
  Edge *this_01;
  HalfEdge **ppHVar2;
  Vertex **ppVVar3;
  bool *pbVar4;
  HalfEdge *he [2];
  Edge *edge;
  undefined1 local_128 [8];
  TreeIterator<MeshLib::Edge> eiter;
  Solid *this_local;
  
  eiter.m_root = (Node<MeshLib::Edge> *)this;
  AVL::TreeIterator<MeshLib::Edge>::TreeIterator
            ((TreeIterator<MeshLib::Edge> *)local_128,&this->m_edges);
  while( true ) {
    bVar1 = AVL::TreeIterator<MeshLib::Edge>::end((TreeIterator<MeshLib::Edge> *)local_128);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = AVL::TreeIterator<MeshLib::Edge>::operator*((TreeIterator<MeshLib::Edge> *)local_128);
    ppHVar2 = Edge::halfedge(this_01,0);
    this_00 = *ppHVar2;
    ppHVar2 = Edge::halfedge(this_01,1);
    if (*ppHVar2 == (HalfEdge *)0x0) {
      ppVVar3 = HalfEdge::vertex(this_00);
      pbVar4 = Vertex::boundary(*ppVVar3);
      *pbVar4 = true;
      ppHVar2 = HalfEdge::he_prev(this_00);
      ppVVar3 = HalfEdge::vertex(*ppHVar2);
      pbVar4 = Vertex::boundary(*ppVVar3);
      *pbVar4 = true;
    }
    AVL::TreeIterator<MeshLib::Edge>::operator++((TreeIterator<MeshLib::Edge> *)local_128);
  }
  AVL::TreeIterator<MeshLib::Edge>::~TreeIterator((TreeIterator<MeshLib::Edge> *)local_128);
  return;
}

Assistant:

void
Solid:: labelBoundaryEdges()
{
	for( AVL::TreeIterator<Edge> eiter( m_edges ); ! eiter.end() ; ++ eiter )
	{
		Edge  *   edge = *eiter;
		HalfEdge* he[2];

		he[0] = edge->halfedge(0);
		he[1] = edge->halfedge(1);
		
		//label boundary
		if( he[1] == NULL )
		{
			he[0]->vertex()->boundary() = true;
			he[0]->he_prev()->vertex()->boundary()  = true;
		}

	}
}